

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::ScopedTrace::ScopedTrace(ScopedTrace *this,char *file,int line,Message *message)

{
  size_type *psVar1;
  string local_68;
  undefined1 local_48 [8];
  TraceInfo trace;
  
  psVar1 = &trace.message._M_string_length;
  trace.message._M_dataplus._M_p = (pointer)0x0;
  trace.message._M_string_length._0_1_ = 0;
  local_48 = (undefined1  [8])file;
  trace.file._0_4_ = line;
  trace._8_8_ = psVar1;
  StringStreamToString(&local_68,(message->ss_).ptr_);
  std::__cxx11::string::operator=((string *)&trace.line,(string *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  UnitTest::GetInstance();
  UnitTest::PushGTestTrace(&UnitTest::GetInstance::instance,(TraceInfo *)local_48);
  if ((size_type *)trace._8_8_ != psVar1) {
    operator_delete((void *)trace._8_8_,
                    CONCAT71(trace.message._M_string_length._1_7_,
                             (undefined1)trace.message._M_string_length) + 1);
  }
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(&UnitTest::mutex_) {
  TraceInfo trace;
  trace.file = file;
  trace.line = line;
  trace.message = message.GetString();

  UnitTest::GetInstance()->PushGTestTrace(trace);
}